

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O3

void list_object(chunk_conflict *c,object *obj)

{
  size_t len;
  ushort uVar1;
  object **ppoVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  chunk_conflict2 *pcVar6;
  
  if (obj != (object *)0x0) {
    uVar4 = (ulong)c->obj_max;
    if (1 < uVar4) {
      uVar5 = 1;
      do {
        if (c->objects[uVar5] == obj) {
          return;
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      if (1 < c->obj_max) {
        uVar5 = 1;
        do {
          if ((((cave != c) || (player->cave == (chunk_conflict2 *)0x0)) ||
              (player->cave->objects[uVar5] == (object *)0x0)) &&
             (c->objects[uVar5] == (object *)0x0)) {
            c->objects[uVar5] = obj;
            obj->oidx = (uint16_t)uVar5;
            return;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    len = uVar4 * 8 + 0x408;
    ppoVar2 = (object **)mem_realloc(c->objects,len);
    c->objects = ppoVar2;
    uVar1 = c->obj_max;
    *(object **)((long)ppoVar2 + (ulong)((uint)uVar1 * 8)) = obj;
    obj->oidx = uVar1;
    lVar3 = 0;
    do {
      *(undefined8 *)((long)c->objects + lVar3 * 8 + (ulong)((uint)uVar1 * 8) + 8) = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    c->obj_max = uVar1 + 0x80;
    if ((cave == c) && (player->cave != (chunk_conflict2 *)0x0)) {
      ppoVar2 = (object **)mem_realloc(player->cave->objects,len);
      pcVar6 = player->cave;
      pcVar6->objects = ppoVar2;
      uVar4 = (ulong)pcVar6->obj_max;
      uVar1 = c->obj_max;
      if (pcVar6->obj_max <= uVar1) {
        do {
          player->cave->objects[uVar4] = (object *)0x0;
          uVar4 = uVar4 + 1;
        } while ((ulong)uVar1 + 1 != uVar4);
        pcVar6 = player->cave;
      }
      pcVar6->obj_max = uVar1;
    }
  }
  return;
}

Assistant:

void list_object(struct chunk *c, struct object *obj)
{
	int i, newsize;

	/* Check for duplicates and objects already deleted or combined */
	if (!obj) return;
	for (i = 1; i < c->obj_max; i++)
		if (c->objects[i] == obj)
			return;

	/* Put objects in holes in the object list */
	for (i = 1; i < c->obj_max; i++) {
		/* If there is a known object, skip this slot */
		if ((c == cave) && player->cave && player->cave->objects[i]) {
			continue;
		}

		/* Put the object in a hole */
		if (c->objects[i] == NULL) {
			c->objects[i] = obj;
			obj->oidx = i;
			return;
		}
	}

	/* Extend the list */
	newsize = (c->obj_max + OBJECT_LIST_INCR + 1) * sizeof(struct object*);
	c->objects = mem_realloc(c->objects, newsize);
	c->objects[c->obj_max] = obj;
	obj->oidx = c->obj_max;
	for (i = c->obj_max + 1; i <= c->obj_max + OBJECT_LIST_INCR; i++)
		c->objects[i] = NULL;
	c->obj_max += OBJECT_LIST_INCR;

	/* If we're on the current level, extend the known list */
	if ((c == cave) && player->cave) {
		player->cave->objects = mem_realloc(player->cave->objects, newsize);
		for (i = player->cave->obj_max; i <= c->obj_max; i++)
			player->cave->objects[i] = NULL;
		player->cave->obj_max = c->obj_max;
	}
}